

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

void Abc_NtkDelayOpt(Sfm_Dec_t *p)

{
  Vec_Int_t *vTfi;
  uint iObj;
  uint uVar1;
  uint uVar2;
  Sfm_Par_t *pPars;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pPivot;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  timespec ts;
  
  pPars = p->pPars;
  pNtk = p->pNtk;
  Abc_NtkCleanMarkABC(pNtk);
  if (pPars->nNodesMax < 0) {
LAB_004b6d46:
    Abc_NtkCleanMarkABC(pNtk);
    return;
  }
  vTfi = &p->vTemp;
  iVar14 = 0;
  do {
    iVar6 = pPars->iNodeOne;
    if (iVar6 == 0) {
      if (((p->pTim != (Sfm_Tim_t *)0x0) &&
          (iVar6 = Sfm_TimPriorityNodes(p->pTim,&p->vCands,p->pPars->nTimeWin), iVar6 == 0)) ||
         ((p->pMit != (Sfm_Mit_t *)0x0 &&
          (iVar6 = Sfm_MitPriorityNodes(p->pMit,&p->vCands,p->pPars->nTimeWin), iVar6 == 0))))
      goto LAB_004b6d46;
    }
    else {
      if ((p->vCands).nCap < 1) {
        piVar10 = (p->vCands).pArray;
        if (piVar10 == (int *)0x0) {
          piVar10 = (int *)malloc(4);
        }
        else {
          piVar10 = (int *)realloc(piVar10,4);
        }
        (p->vCands).pArray = piVar10;
        if (piVar10 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (p->vCands).nCap = 1;
      }
      *(p->vCands).pArray = iVar6;
      (p->vCands).nSize = 1;
    }
    if (0 < (p->vCands).nSize) {
      uVar13 = 0;
      do {
        iVar6 = (p->vCands).pArray[uVar13];
        if (((long)iVar6 < 0) || (pVVar3 = p->pNtk->vObjs, pVVar3->nSize <= iVar6)) {
LAB_004b6d60:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pPivot = (Abc_Obj_t *)pVVar3->pArray[iVar6];
        if (pPivot != (Abc_Obj_t *)0x0) {
          iObj = pPivot->Id;
          if (p->pMit == (Sfm_Mit_t *)0x0) {
            iVar6 = Sfm_TimReadObjDelay(p->pTim,iObj);
          }
          else {
            iVar6 = Sfm_MitReadObjDelay(p->pMit,iObj);
          }
          if ((pPivot->field_0x14 & 0x10) != 0) {
            __assert_fail("pObj->fMarkA == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x7cc,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
          }
          p->nNodesTried = p->nNodesTried + 1;
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar11 = 1;
          }
          else {
            lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          iVar7 = Sfm_DecExtract(pNtk,pPars,pPivot,&p->vObjRoots,&p->vObjGates,&p->vObjFanins,
                                 &p->vObjMap,vTfi,&p->vTemp2,&p->vObjMffc,&p->vObjInMffc,p->pTim,
                                 p->pMit);
          p->nDivs = iVar7;
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeWin = p->timeWin + lVar12 + lVar11;
          if ((1 < p->nDivs) &&
             ((pPars->nWinSizeMax == 0 || ((p->vObjGates).nSize <= pPars->nWinSizeMax)))) {
            p->nMffc = (p->vObjMffc).nSize;
            iVar7 = Sfm_DecMffcArea(pNtk,&p->vObjMffc);
            p->AreaMffc = iVar7;
            iVar7 = p->nDivs;
            iVar8 = p->nMaxDivs;
            if (p->nMaxDivs <= iVar7) {
              iVar8 = iVar7;
            }
            p->nMaxDivs = iVar8;
            p->nAllDivs = p->nAllDivs + (long)iVar7;
            p->iTarget = (pPivot->field_6).iTemp;
            iVar7 = (p->vObjGates).nSize;
            iVar8 = p->nMaxWin;
            if (p->nMaxWin <= iVar7) {
              iVar8 = iVar7;
            }
            p->nMaxWin = iVar8;
            p->nAllWin = p->nAllWin + (long)iVar7;
            iVar8 = clock_gettime(3,(timespec *)&ts);
            if (iVar8 < 0) {
              lVar11 = 1;
            }
            else {
              lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
              lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
            }
            iVar8 = Sfm_DecPrepareSolver(p);
            iVar9 = clock_gettime(3,(timespec *)&ts);
            if (iVar9 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            p->timeCnf = p->timeCnf + lVar12 + lVar11;
            if (iVar8 != 0) {
              iVar8 = clock_gettime(3,(timespec *)&ts);
              if (iVar8 < 0) {
                lVar11 = 1;
              }
              else {
                lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
              }
              iVar8 = Sfm_DecPeformDec3(p,pPivot);
              if (((pPars->fMoreEffort != 0) && (iVar8 < 0)) &&
                 (lVar12 = (long)(p->vObjInMffc).nSize, 0 < lVar12)) {
                do {
                  if ((p->vObjInMffc).nSize < lVar12) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  p->iUseThis = (p->vObjInMffc).pArray[lVar12 + -1];
                  iVar8 = Sfm_DecPeformDec3(p,pPivot);
                  p->iUseThis = -1;
                  if (-1 < iVar8) {
                    p->nEfforts = p->nEfforts + 1;
                    break;
                  }
                  bVar5 = 1 < lVar12;
                  lVar12 = lVar12 + -1;
                } while (bVar5);
              }
              if (p->pPars->fVeryVerbose != 0) {
                puts("\n");
              }
              iVar9 = clock_gettime(3,(timespec *)&ts);
              if (iVar9 < 0) {
                lVar12 = -1;
              }
              else {
                lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              p->timeSat = p->timeSat + lVar12 + lVar11;
              if (-1 < iVar8) {
                iVar8 = (p->vObjGates).nSize;
                if (iVar8 <= iVar7) {
                  __assert_fail("Vec_IntSize(&p->vObjGates) - Limit > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                                ,0x808,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                }
                if (2 < iVar8 - iVar7) {
                  __assert_fail("Vec_IntSize(&p->vObjGates) - Limit <= 2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                                ,0x809,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                }
                p->nNodesChanged = p->nNodesChanged + 1;
                Abc_NtkCountStats(p,iVar7);
                if (p->pMit != (Sfm_Mit_t *)0x0) {
                  Sfm_MitUpdateLoad(p->pMit,&p->vTemp3,0);
                }
                Sfm_DecInsert(pNtk,pPivot,iVar7,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                              &p->vGateHands,p->GateBuffer,p->GateInvert,&p->vGateFuncs,vTfi,p->pMit
                             );
                if (p->pMit != (Sfm_Mit_t *)0x0) {
                  Sfm_MitUpdateLoad(p->pMit,vTfi,1);
                }
                iVar7 = clock_gettime(3,(timespec *)&ts);
                if (iVar7 < 0) {
                  lVar11 = 1;
                }
                else {
                  lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
                  lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
                }
                if (p->pMit == (Sfm_Mit_t *)0x0) {
                  Sfm_TimUpdateTiming(p->pTim,vTfi);
                }
                else {
                  Sfm_MitUpdateTiming(p->pMit,vTfi);
                }
                iVar7 = clock_gettime(3,(timespec *)&ts);
                if (iVar7 < 0) {
                  lVar12 = -1;
                }
                else {
                  lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
                }
                p->timeTime = p->timeTime + lVar12 + lVar11;
                lVar11 = (long)pNtk->vObjs->nSize;
                if (lVar11 < 1) goto LAB_004b6d60;
                pvVar4 = pNtk->vObjs->pArray[lVar11 + -1];
                if (((p->pMit == (Sfm_Mit_t *)0x0) && (iVar7 = p->DelayMin, iVar7 != 0)) &&
                   (iVar8 = Sfm_TimReadObjDelay(p->pTim,*(int *)((long)pvVar4 + 0x10)),
                   iVar7 != iVar8)) {
                  __assert_fail("p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew))"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                                ,0x818,"void Abc_NtkDelayOpt(Sfm_Dec_t *)");
                }
                if (pPars->fDelayVerbose != 0) {
                  uVar1 = p->pNtk->vObjs->nSize;
                  uVar2 = (p->vCands).nSize;
                  iVar7 = p->pNtk->nObjCounts[7];
                  iVar8 = *(int *)((long)pvVar4 + 0x10);
                  if (p->pMit == (Sfm_Mit_t *)0x0) {
                    iVar8 = Sfm_TimReadObjDelay(p->pTim,iVar8);
                  }
                  else {
                    iVar8 = Sfm_MitReadObjDelay(p->pMit,iVar8);
                  }
                  if (p->pMit == (Sfm_Mit_t *)0x0) {
                    iVar9 = Sfm_TimReadNtkDelay(p->pTim);
                  }
                  else {
                    iVar9 = Sfm_MitReadNtkDelay(p->pMit);
                  }
                  printf("Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f\n"
                         ,SUB84(((double)(int)uVar2 * 100.0) / (double)iVar7,0),
                         (double)iVar6 * 0.001,(double)iVar8 * 0.001,(double)iVar9 * 0.001,
                         (ulong)iObj,(ulong)uVar1,uVar13 & 0xffffffff,(ulong)uVar2);
                }
                break;
              }
            }
          }
          pPivot->field_0x14 = pPivot->field_0x14 | 0x10;
        }
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < (long)(p->vCands).nSize);
    }
    if ((pPars->iNodeOne != 0) ||
       (iVar14 = iVar14 + 1, pPars->nNodesMax <= iVar14 && pPars->nNodesMax != 0))
    goto LAB_004b6d46;
  } while( true );
}

Assistant:

void Abc_NtkDelayOpt( Sfm_Dec_t * p )
{
    Abc_Ntk_t * pNtk = p->pNtk;
    Sfm_Par_t * pPars = p->pPars; int n;
    Abc_NtkCleanMarkABC( pNtk );
    for ( n = 0; pPars->nNodesMax == 0 || n < pPars->nNodesMax; n++ )
    {
        Abc_Obj_t * pObj, * pObjNew; abctime clk;
        int i = 0, Limit, RetValue;
        // collect nodes
        if ( pPars->iNodeOne )
            Vec_IntFill( &p->vCands, 1, pPars->iNodeOne );
        else if ( p->pTim && !Sfm_TimPriorityNodes(p->pTim, &p->vCands, p->pPars->nTimeWin) )
            break;
        else if ( p->pMit && !Sfm_MitPriorityNodes(p->pMit, &p->vCands, p->pPars->nTimeWin) )
            break;
        // try improving delay for the nodes according to the priority
        Abc_NtkForEachObjVec( &p->vCands, p->pNtk, pObj, i )
        {
            int OldId = Abc_ObjId(pObj);
            int DelayOld = Sfm_ManReadObjDelay(p, OldId);
            assert( pObj->fMarkA == 0 );
            p->nNodesTried++;
clk = Abc_Clock();
            p->nDivs = Sfm_DecExtract( pNtk, pPars, pObj, &p->vObjRoots, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vTemp, &p->vTemp2, &p->vObjMffc, &p->vObjInMffc, p->pTim, p->pMit );
p->timeWin += Abc_Clock() - clk;
            if ( p->nDivs < 2 || (pPars->nWinSizeMax && pPars->nWinSizeMax < Vec_IntSize(&p->vObjGates)) )
            { 
                pObj->fMarkA = 1;
                continue;
            }
            p->nMffc = Vec_IntSize(&p->vObjMffc);
            p->AreaMffc = Sfm_DecMffcArea(pNtk, &p->vObjMffc);
            p->nMaxDivs = Abc_MaxInt( p->nMaxDivs, p->nDivs );
            p->nAllDivs += p->nDivs;
            p->iTarget = pObj->iTemp;
            Limit = Vec_IntSize( &p->vObjGates );
            p->nMaxWin = Abc_MaxInt( p->nMaxWin, Limit );
            p->nAllWin += Limit;
clk = Abc_Clock();
            RetValue = Sfm_DecPrepareSolver( p );
p->timeCnf += Abc_Clock() - clk;
            if ( !RetValue )
            {
                pObj->fMarkA = 1;
                continue;
            }
clk = Abc_Clock();
            RetValue = Sfm_DecPeformDec3( p, pObj );
            if ( pPars->fMoreEffort && RetValue < 0 )
            {
                int Var, i;
                Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
                {
                    p->iUseThis = Var; 
                    RetValue = Sfm_DecPeformDec3( p, pObj );
                    p->iUseThis = -1;
                    if ( RetValue < 0 )
                    {
                        //printf( "Node %d: Not found among %d.\n", Abc_ObjId(pObj), Vec_IntSize(&p->vObjInMffc) );
                    }
                    else
                    {
                        p->nEfforts++;
                        if ( p->pPars->fVerbose )
                        {
                            //printf( "Node %5d: (%2d out of %2d)  Gate=%s ", Abc_ObjId(pObj), i, Vec_IntSize(&p->vObjInMffc), Mio_GateReadName((Mio_Gate_t*)pObj->pData) );
                            //Dau_DsdPrintFromTruth( p->Copy, p->nSuppVars );
                        }
                        break;
                    }
                }
            }
            if ( p->pPars->fVeryVerbose )
                printf( "\n\n" );
p->timeSat += Abc_Clock() - clk;
            if ( RetValue < 0 )
            {
                pObj->fMarkA = 1;
                continue;
            }
            assert( Vec_IntSize(&p->vObjGates) - Limit > 0 );
            assert( Vec_IntSize(&p->vObjGates) - Limit <= 2 );
            p->nNodesChanged++;
            Abc_NtkCountStats( p, Limit );
            // reduce load due to removed MFFC
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vTemp3, 0 ); // assuming &p->vTemp3 contains MFFC
            Sfm_DecInsert( pNtk, pObj, Limit, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateHands, p->GateBuffer, p->GateInvert, &p->vGateFuncs, &p->vTemp, p->pMit );
            // increase load due to added new nodes
            if ( p->pMit ) Sfm_MitUpdateLoad( p->pMit, &p->vTemp, 1 ); // assuming &p->vTemp contains new nodes
clk = Abc_Clock();
            if ( p->pMit )
                Sfm_MitUpdateTiming( p->pMit, &p->vTemp );
            else
                Sfm_TimUpdateTiming( p->pTim, &p->vTemp );
p->timeTime += Abc_Clock() - clk;
            pObjNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk)-1 );
            assert( p->pMit || p->DelayMin == 0 || p->DelayMin == Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew)) );
            // report
            if ( pPars->fDelayVerbose )
                printf( "Node %5d  %5d :  I =%3d.  Cand = %5d (%6.2f %%)   Old =%8.2f.  New =%8.2f.  Final =%8.2f\n", 
                    OldId, Abc_NtkObjNumMax(p->pNtk), i, Vec_IntSize(&p->vCands), 100.0 * Vec_IntSize(&p->vCands) / Abc_NtkNodeNum(p->pNtk),
                    MIO_NUMINV*DelayOld, MIO_NUMINV*Sfm_ManReadObjDelay(p, Abc_ObjId(pObjNew)), 
                    MIO_NUMINV*Sfm_ManReadNtkDelay(p) );
            break;
        }
        if ( pPars->iNodeOne )
            break;
    }
    Abc_NtkCleanMarkABC( pNtk );
}